

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

LaneArray<2> * __thiscall
wasm::Literal::getLanesF64x2(LaneArray<2> *__return_storage_ptr__,Literal *this)

{
  anon_union_16_5_9943fe1e_for_Literal_0 *this_00;
  bool bVar1;
  long lVar2;
  bool bVar3;
  anon_union_16_5_9943fe1e_for_Literal_0 local_40;
  undefined8 local_30;
  
  getLanesI64x2(__return_storage_ptr__,this);
  lVar2 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    if (__return_storage_ptr__->_M_elems[lVar2].type.id != 3) {
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x14f,"Literal wasm::Literal::castToF64()");
    }
    this_00 = &__return_storage_ptr__->_M_elems[lVar2].field_0;
    local_30 = 5;
    local_40.i64 = ((anon_union_16_5_9943fe1e_for_Literal_0 *)&(this_00->func).super_IString)->i64;
    if (this_00 != &local_40) {
      ~Literal((Literal *)&this_00->func);
      Literal((Literal *)&this_00->func,(Literal *)&local_40.func);
    }
    ~Literal((Literal *)&local_40.func);
    lVar2 = 1;
    bVar1 = false;
  } while (bVar3);
  return __return_storage_ptr__;
}

Assistant:

LaneArray<2> Literal::getLanesF64x2() const {
  auto lanes = getLanesI64x2();
  for (size_t i = 0; i < lanes.size(); ++i) {
    lanes[i] = lanes[i].castToF64();
  }
  return lanes;
}